

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_sample_grad_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  pointer ppOVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint32_t image_ops_00;
  Id IVar5;
  bool bVar6;
  bool bVar7;
  ComponentType element_type;
  uint i;
  Id IVar8;
  Id IVar9;
  ValueKind VVar10;
  Value *pVVar11;
  mapped_type *pmVar12;
  Value *pVVar13;
  Value *value;
  mapped_type *pmVar14;
  Type *pTVar15;
  Builder *pBVar16;
  Operation *this;
  Operation *this_00;
  Operation *pOVar17;
  Op OVar18;
  Operation **op;
  pointer ppOVar19;
  uint uVar20;
  Op op_00;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint32_t image_ops;
  ComponentType tmp;
  Id grad_x [3];
  uint num_coords;
  uint num_coords_full;
  Value *mult_grad_x [3];
  Id loaded_id;
  Id image_id;
  Id coord [4];
  Id offsets [3];
  undefined1 in_stack_fffffffffffffee8;
  Value *local_108;
  uint32_t local_fc;
  ulong local_f8;
  ComponentType local_e9;
  ulong local_e8;
  Builder *local_e0;
  Value *local_d8;
  Id local_d0 [4];
  mapped_type *local_c0;
  Id local_b8 [4];
  uint local_a8;
  Id local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  Vector<spv::Id> local_98;
  ulong local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  Id local_60;
  Id local_5c;
  undefined1 local_58 [16];
  Id local_40 [4];
  
  if ((opcode != SampleCmpGrad) &&
     (bVar6 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction), !bVar6)) {
    return true;
  }
  local_e0 = Converter::Impl::builder(impl);
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  local_5c = IVar8;
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar9 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  IVar8 = Converter::Impl::build_sampled_image(impl,IVar8,IVar9,opcode == SampleCmpGrad);
  pmVar12 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_5c);
  local_9c = 0;
  local_a0 = 0;
  bVar6 = get_image_dimensions(impl,local_5c,&local_9c,&local_a0);
  uVar21 = local_9c;
  if (!bVar6) {
    return bVar6;
  }
  local_fc = 4;
  local_58 = (undefined1  [16])0x0;
  uVar22 = (ulong)local_9c;
  local_c0 = pmVar12;
  local_a4 = IVar8;
  if (uVar22 != 0) {
    uVar23 = 0;
    do {
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar23 + 3);
      IVar8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      *(Id *)(local_58 + uVar23 * 4) = IVar8;
      uVar23 = uVar23 + 1;
    } while (uVar22 != uVar23);
  }
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  uVar23 = (ulong)local_a0;
  get_texel_offsets(impl,instruction,&local_fc,7,local_a0,local_40,(bool)in_stack_fffffffffffffee8);
  local_f8 = (ulong)(opcode == SampleCmpGrad | 10);
  local_e8 = uVar23;
  if ((impl->current_block == (Vector<Operation_*> *)0x0) ||
     ((impl->options).grad_opt.enabled != true)) {
LAB_0016d1ff:
    uVar22 = local_e8;
    local_b8[2] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_d0[2] = 0;
    local_d0[0] = 0;
    local_d0[1] = 0;
    bVar4 = true;
    if (local_e8 == 0) {
      local_f8 = 0;
    }
    else {
      iVar2 = (int)local_f8;
      uVar23 = 0;
      do {
        pVVar11 = LLVMBC::Instruction::getOperand
                            (&instruction->super_Instruction,iVar2 + (int)uVar23);
        IVar8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
        local_d0[uVar23] = IVar8;
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
      if (uVar22 == 0) {
        local_f8 = 0;
      }
      else {
        local_f8 = 0;
        uVar23 = 0;
        do {
          pVVar11 = LLVMBC::Instruction::getOperand
                              (&instruction->super_Instruction,iVar2 + 3 + (int)uVar23);
          IVar8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
          local_b8[uVar23] = IVar8;
          uVar23 = uVar23 + 1;
        } while (uVar22 != uVar23);
      }
    }
  }
  else {
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (iterator)0x0;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (Id *)0x0;
    local_68 = 0;
    local_78 = (undefined1  [16])0x0;
    local_80 = uVar22;
    if (uVar23 == 0) {
      local_d8 = (Value *)0x0;
      bVar4 = true;
      local_108 = (Value *)0x0;
    }
    else {
      bVar4 = true;
      uVar22 = 0;
      do {
        iVar2 = (int)uVar22;
        pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,iVar2 + 3);
        pVVar13 = LLVMBC::Internal::resolve_proxy(pVVar11);
        VVar10 = LLVMBC::Value::get_value_kind(pVVar13);
        bVar7 = LLVMBC::Constant::is_base_of_value_kind(VVar10);
        if (bVar7) goto LAB_0016d1cb;
        iVar3 = (int)local_f8;
        pVVar13 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,iVar3 + iVar2);
        value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,iVar3 + iVar2 + 3);
        IVar8 = Converter::Impl::get_id_for_value(impl,pVVar13,0);
        IVar9 = Converter::Impl::get_id_for_value(impl,value,0);
        if ((IVar8 == 0) || (IVar9 == 0)) goto LAB_0016d1cb;
        ppOVar19 = (impl->current_block->
                   super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppOVar1 = (impl->current_block->
                  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (ppOVar19 == ppOVar1) goto LAB_0016d1cb;
        do {
          IVar5 = 0;
          if ((*ppOVar19)->id != IVar8) {
            IVar5 = IVar8;
          }
          IVar8 = IVar5;
          IVar5 = 0;
          if ((*ppOVar19)->id != IVar9) {
            IVar5 = IVar9;
          }
          IVar9 = IVar5;
          ppOVar19 = ppOVar19 + 1;
        } while (ppOVar19 != ppOVar1);
        if (((IVar8 != 0 || IVar9 != 0) ||
            (bVar7 = binary_op_is_multiple_of_derivative
                               (pVVar13,pVVar11,DerivCoarseX,DerivFineX,
                                (Value **)
                                (&local_98.
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar22)), !bVar7)) ||
           (bVar7 = binary_op_is_multiple_of_derivative
                              (value,pVVar11,DerivCoarseY,DerivFineY,
                               (Value **)(local_78 + uVar22 * 8)), !bVar7)) goto LAB_0016d1cb;
        uVar22 = uVar22 + 1;
      } while (uVar22 != local_e8);
      uVar22 = 0;
      do {
        pVVar11 = (Value *)(&local_98.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start)[uVar22];
        if (((pVVar11 == (Value *)0x0) || (*(Value **)(local_78 + uVar22 * 8) == (Value *)0x0)) ||
           ((uVar22 != 0 &&
            ((pVVar11 !=
              (Value *)local_98.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start ||
             (*(Value **)(local_78 + uVar22 * 8) != (Value *)local_78._0_8_)))))) goto LAB_0016d1cb;
        uVar22 = uVar22 + 1;
      } while (local_e8 != uVar22);
      if (local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)local_78._0_8_) {
        if ((impl->options).grad_opt.assume_uniform_scale != true) {
LAB_0016d1cb:
          uVar21 = (uint)local_80;
          goto LAB_0016d1ff;
        }
        bVar4 = false;
      }
      local_d8 = (Value *)local_78._0_8_;
      local_108 = (Value *)local_98.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    }
    pBVar16 = Converter::Impl::builder(impl);
    if (impl->glsl_std450_ext == 0) {
      IVar8 = spv::Builder::import(pBVar16,"GLSL.std.450");
      impl->glsl_std450_ext = IVar8;
    }
    IVar8 = spv::Builder::makeFloatType(pBVar16,0x20);
    this = Converter::Impl::allocate(impl,OpExtInst,IVar8);
    Operation::add_id(this,impl->glsl_std450_ext);
    Operation::add_literal(this,4);
    IVar9 = Converter::Impl::get_id_for_value(impl,local_108,0);
    Operation::add_id(this,IVar9);
    Converter::Impl::add(impl,this,false);
    pOVar17 = this;
    if (!bVar4) {
      this_00 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
      Operation::add_id(this_00,impl->glsl_std450_ext);
      Operation::add_literal(this_00,4);
      IVar9 = Converter::Impl::get_id_for_value(impl,local_d8,0);
      Operation::add_id(this_00,IVar9);
      Converter::Impl::add(impl,this_00,false);
      pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
      Operation::add_id(pOVar17,impl->glsl_std450_ext);
      Operation::add_literal(pOVar17,0x25);
      Operation::add_id(pOVar17,this->id);
      Operation::add_id(pOVar17,this_00->id);
      Converter::Impl::add(impl,pOVar17,false);
    }
    IVar9 = pOVar17->id;
    pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
    Operation::add_id(pOVar17,impl->glsl_std450_ext);
    Operation::add_literal(pOVar17,0x1e);
    Operation::add_id(pOVar17,IVar9);
    Converter::Impl::add(impl,pOVar17,false);
    local_d0[2] = 0;
    local_d0[0] = 0;
    local_d0[1] = 0;
    local_b8[2] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    uVar21 = (uint)local_80;
    if (pOVar17->id == 0) goto LAB_0016d1ff;
    local_fc = 1;
    bVar4 = false;
    local_f8 = (ulong)pOVar17->id;
  }
  uVar20 = opcode == SampleCmpGrad | 0x10;
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar20);
  pVVar11 = LLVMBC::Internal::resolve_proxy(pVVar11);
  VVar10 = LLVMBC::Value::get_value_kind(pVVar11);
  IVar8 = 0;
  if (VVar10 != Undef) {
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar20);
    IVar8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    local_fc = local_fc | 0x80;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x2a;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_e0->capabilities,(Capability *)&local_98);
  }
  local_d8 = (Value *)CONCAT44(local_d8._4_4_,IVar8);
  local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)instruction;
  pmVar14 = std::__detail::
            _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->llvm_composite_meta,(key_type *)&local_98);
  uVar20 = pmVar14->access_mask;
  if ((uVar20 & 0x10) != 0) {
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x29;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_e0->capabilities,(Capability *)&local_98);
  }
  element_type = Converter::Impl::get_effective_typed_resource_type(local_c0->component_type);
  local_a8 = (uint)(opcode != SampleCmpGrad) * 3 + 1;
  IVar8 = Converter::Impl::get_type_id(impl,element_type,1,local_a8,false);
  if ((uVar20 & 0x10) != 0) {
    IVar9 = spv::Builder::makeIntegerType(local_e0,0x20,false);
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 2;
    *local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar9;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar8;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    IVar8 = Converter::Impl::get_struct_type(impl,&local_98,0,"SparseTexel");
    if (local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_98.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (opcode == SampleCmpGrad) {
    bVar7 = (uVar20 & 0x10) == 0;
    OVar18 = OpImageSparseSampleDrefImplicitLod;
    if (bVar7) {
      OVar18 = OpImageSampleDrefImplicitLod;
    }
    op_00 = OpImageSparseSampleDrefExplicitLod;
    if (bVar7) {
      op_00 = OpImageSampleDrefExplicitLod;
    }
    if (!bVar4) {
      op_00 = OVar18;
    }
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,10);
    IVar9 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  }
  else {
    if (bVar4) {
      OVar18 = OpImageSampleExplicitLod;
      op_00 = OpImageSparseSampleExplicitLod;
    }
    else {
      OVar18 = OpImageSampleImplicitLod;
      op_00 = OpImageSparseSampleImplicitLod;
    }
    if ((uVar20 & 0x10) == 0) {
      op_00 = OVar18;
    }
    IVar9 = 0;
  }
  pOVar17 = Converter::Impl::allocate(impl,op_00,(Value *)instruction,IVar8);
  if ((uVar20 & 0x10) == 0) {
    pTVar15 = LLVMBC::Value::getType((Value *)instruction);
    pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar15,pOVar17->id,true);
  }
  Operation::add_id(pOVar17,local_a4);
  IVar8 = spv::Builder::makeFloatType(local_e0,0x20);
  IVar8 = Converter::Impl::build_vector(impl,IVar8,(Id *)local_58,uVar21);
  Operation::add_id(pOVar17,IVar8);
  if (IVar9 != 0) {
    Operation::add_id(pOVar17,IVar9);
  }
  image_ops_00 = local_fc;
  Operation::add_literal(pOVar17,local_fc);
  pBVar16 = local_e0;
  if ((image_ops_00 & 4) == 0) {
    IVar8 = (Id)local_f8;
    if ((image_ops_00 & 1) == 0) goto LAB_0016d588;
  }
  else {
    IVar8 = spv::Builder::makeFloatType(local_e0,0x20);
    uVar21 = (uint)local_e8;
    IVar8 = Converter::Impl::build_vector(impl,IVar8,local_d0,uVar21);
    Operation::add_id(pOVar17,IVar8);
    IVar8 = spv::Builder::makeFloatType(pBVar16,0x20);
    IVar8 = Converter::Impl::build_vector(impl,IVar8,local_b8,uVar21);
  }
  Operation::add_id(pOVar17,IVar8);
LAB_0016d588:
  if ((image_ops_00 & 0x18) != 0) {
    IVar8 = build_texel_offset_vector(impl,local_40,(uint)local_e8,image_ops_00,false);
    Operation::add_id(pOVar17,IVar8);
  }
  if ((char)image_ops_00 < '\0') {
    Operation::add_id(pOVar17,(Id)local_d8);
  }
  Converter::Impl::add(impl,pOVar17,false);
  pTVar15 = LLVMBC::Value::getType((Value *)instruction);
  pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
  if ((uVar20 & 0x10) == 0) {
    if (opcode == SampleCmpGrad) {
      local_60 = pOVar17->id;
      local_e9 = local_c0->component_type;
      Converter::Impl::fixup_load_type_typed(impl,&local_e9,1,&local_60,pTVar15);
      IVar8 = Converter::Impl::get_type_id(impl,pTVar15,0);
      IVar8 = spv::Builder::makeVectorType(local_e0,IVar8,4);
      pOVar17 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar8);
      local_78._4_4_ = local_60;
      local_78._0_4_ = local_60;
      local_78._8_4_ = local_60;
      local_78._12_4_ = local_60;
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
      Operation::add_ids(pOVar17,(initializer_list<unsigned_int> *)&local_98);
      Converter::Impl::add(impl,pOVar17,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar17->id);
    }
    else {
      Converter::Impl::fixup_load_type_typed
                (impl,local_c0->component_type,4,(Value *)instruction,pTVar15);
      build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (impl,local_c0->component_type,local_a8,(Value *)instruction,pTVar15,0);
  }
  return bVar6;
}

Assistant:

bool emit_sample_grad_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmpGrad;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	uint32_t image_ops = spv::ImageOperandsGradMask;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	unsigned grad_argument_index = comparison_sampling ? 11 : 10;
	spv::Id bias_id = sample_grad_is_lod_bias(impl, instruction, num_coords, grad_argument_index);

	spv::Id grad_x[3] = {};
	spv::Id grad_y[3] = {};

	if (bias_id)
	{
		image_ops = spv::ImageOperandsBiasMask;
	}
	else
	{
		for (unsigned i = 0; i < num_coords; i++)
			grad_x[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index));
		for (unsigned i = 0; i < num_coords; i++)
			grad_y[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index + 3));
	}

	unsigned min_lod_argument_index = comparison_sampling ? 17 : 16;
	spv::Id aux_argument = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
	{
		aux_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
		image_ops |= spv::ImageOperandsMinLodMask;
		builder.addCapability(spv::CapabilityMinLod);
	}

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Id dref_id = 0;
	spv::Op spv_op;
	if (comparison_sampling)
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;

		dref_id = impl.get_id_for_value(instruction->getOperand(10));
	}
	else
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
	}

	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_x, num_coords));
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_y, num_coords));
	}
	else if (image_ops & spv::ImageOperandsBiasMask)
		op->add_id(bias_id);

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
		op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(aux_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}